

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O2

char * ucnv_io_nextAllConverters(UEnumeration *enumerator,int32_t *resultLength,UErrorCode *param_3)

{
  ushort uVar1;
  uint16_t *puVar2;
  int32_t iVar3;
  uint16_t *puVar5;
  size_t sVar4;
  
  puVar5 = gMainTable.stringTable;
  puVar2 = gMainTable.converterList;
  uVar1 = *enumerator->context;
  if (uVar1 < gMainTable.converterListSize) {
    *(ushort *)enumerator->context = uVar1 + 1;
    puVar5 = puVar5 + puVar2[uVar1];
    if (resultLength == (int32_t *)0x0) {
      return (char *)puVar5;
    }
    sVar4 = strlen((char *)puVar5);
    iVar3 = (int32_t)sVar4;
  }
  else {
    iVar3 = 0;
    puVar5 = (uint16_t *)0x0;
    if (resultLength == (int32_t *)0x0) {
      return (char *)0x0;
    }
  }
  *resultLength = iVar3;
  return (char *)puVar5;
}

Assistant:

static const char * U_CALLCONV
ucnv_io_nextAllConverters(UEnumeration *enumerator,
                            int32_t* resultLength,
                            UErrorCode * /*pErrorCode*/)
{
    uint16_t *myContext = (uint16_t *)(enumerator->context);

    if (*myContext < gMainTable.converterListSize) {
        const char *myStr = GET_STRING(gMainTable.converterList[(*myContext)++]);
        if (resultLength) {
            *resultLength = (int32_t)uprv_strlen(myStr);
        }
        return myStr;
    }
    /* Either we accessed a zero length list, or we enumerated too far. */
    if (resultLength) {
        *resultLength = 0;
    }
    return NULL;
}